

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_vmevent.c
# Opt level: O3

ptrdiff_t lj_vmevent_prepare(lua_State *L,VMEvent ev)

{
  byte *pbVar1;
  uint uVar2;
  GCstr *pGVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  ulong uVar6;
  uint *puVar7;
  Node *n;
  VMEvent key;
  GCtab *t;
  
  uVar2 = (L->glref).ptr32;
  pGVar3 = lj_str_new(L,"_VMEVENTS",9);
  uVar6 = (ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x98);
  for (puVar7 = (uint *)((ulong)*(uint *)(uVar6 + 0x14) +
                        (ulong)(pGVar3->hash & *(uint *)(uVar6 + 0x1c)) * 0x18);
      (puVar7[3] != 0xfffffffb || (pGVar3 != (GCstr *)(ulong)puVar7[2]));
      puVar7 = (uint *)(ulong)puVar7[4]) {
  }
  if (puVar7[1] == 0xfffffff4) {
    key = ev & 0xfffffff8;
    t = (GCtab *)(ulong)*puVar7;
    if (key < t->asize) {
      pcVar4 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
    }
    else {
      pcVar4 = lj_tab_getinth(t,key);
    }
    if ((pcVar4 != (cTValue *)0x0) && ((pcVar4->field_2).it == 0xfffffff7)) {
      pTVar5 = L->top;
      if ((long)((ulong)(L->maxstack).ptr32 - (long)pTVar5) < 0xa1) {
        lj_state_growstack(L,0x14);
        pTVar5 = L->top;
      }
      L->top = pTVar5 + 1;
      (pTVar5->field_2).field_0 = (pcVar4->field_2).field_0;
      (pTVar5->field_2).it = 0xfffffff7;
      return (long)L->top - (ulong)(L->stack).ptr32;
    }
  }
  pbVar1 = (byte *)((ulong)uVar2 + 0x93);
  *pbVar1 = *pbVar1 & ~(byte)(1 << ((byte)ev & 7));
  return 0;
}

Assistant:

ptrdiff_t lj_vmevent_prepare(lua_State *L, VMEvent ev)
{
  global_State *g = G(L);
  GCstr *s = lj_str_newlit(L, LJ_VMEVENTS_REGKEY);
  cTValue *tv = lj_tab_getstr(tabV(registry(L)), s);
  if (tvistab(tv)) {
    int hash = VMEVENT_HASH(ev);
    tv = lj_tab_getint(tabV(tv), hash);
    if (tv && tvisfunc(tv)) {
      lj_state_checkstack(L, LUA_MINSTACK);
      setfuncV(L, L->top++, funcV(tv));
      return savestack(L, L->top);
    }
  }
  g->vmevmask &= ~VMEVENT_MASK(ev);  /* No handler: cache this fact. */
  return 0;
}